

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom-formatter-test.cc
# Opt level: O0

string * custom_vformat_abi_cxx11_(string_view format_str,format_args args)

{
  char *pcVar1;
  size_t sVar2;
  string *in_RDI;
  memory_buffer buffer;
  allocator<char> *in_stack_fffffffffffffd18;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *in_stack_fffffffffffffd20;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *this;
  basic_buffer<char> *in_stack_fffffffffffffd28;
  back_insert_range<fmt::v5::internal::basic_buffer<char>_> *in_stack_fffffffffffffd30;
  allocator local_299;
  basic_buffer<char> *local_298;
  locale_ref local_290 [9];
  allocator<char> local_241 [65];
  locale_ref in_stack_fffffffffffffe00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  in_stack_fffffffffffffe08;
  basic_string_view<char> in_stack_fffffffffffffe18;
  back_insert_iterator<fmt::v5::internal::basic_buffer<char>_> in_stack_fffffffffffffe28;
  
  std::allocator<char>::allocator();
  fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  std::allocator<char>::~allocator(local_241);
  fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>::back_insert_range
            (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  fmt::v5::internal::locale_ref::locale_ref(local_290);
  local_298 = (basic_buffer<char> *)
              fmt::v5::
              vformat_to<custom_arg_formatter,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                        (in_stack_fffffffffffffe28.container,in_stack_fffffffffffffe18,
                         in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  this = (basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)(local_241 + 1);
  pcVar1 = fmt::v5::internal::basic_buffer<char>::data((basic_buffer<char> *)this);
  sVar2 = fmt::v5::internal::basic_buffer<char>::size((basic_buffer<char> *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,pcVar1,sVar2,&local_299);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer(this);
  return in_RDI;
}

Assistant:

std::string custom_vformat(fmt::string_view format_str, fmt::format_args args) {
  fmt::memory_buffer buffer;
  // Pass custom argument formatter as a template arg to vwrite.
  fmt::vformat_to<custom_arg_formatter>(buffer, format_str, args);
  return std::string(buffer.data(), buffer.size());
}